

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SanityCheckPass.h
# Opt level: O3

void __thiscall
soul::SanityCheckPass::PostResolutionChecks::visit(PostResolutionChecks *this,Processor *p)

{
  pointer ppVar1;
  pointer ppVar2;
  Expression *pEVar3;
  int iVar4;
  pool_ref<soul::AST::Function> *extraout_RDX;
  pointer ppVar5;
  pointer ppVar6;
  ArrayView<soul::pool_ref<soul::AST::Function>_> functions;
  CompileMessage local_50;
  
  ASTVisitor::visit(&this->super_ASTVisitor,p);
  functions.e = extraout_RDX;
  functions.s = (p->functions).
                super__Vector_base<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  checkForDuplicateFunctions
            ((SanityCheckPass *)
             (p->functions).
             super__Vector_base<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>
             ._M_impl.super__Vector_impl_data._M_start,functions);
  ppVar1 = (p->super_ProcessorBase).endpoints.
           super__Vector_base<soul::pool_ref<soul::AST::EndpointDeclaration>,_std::allocator<soul::pool_ref<soul::AST::EndpointDeclaration>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar5 = (p->super_ProcessorBase).endpoints.
                super__Vector_base<soul::pool_ref<soul::AST::EndpointDeclaration>,_std::allocator<soul::pool_ref<soul::AST::EndpointDeclaration>_>_>
                ._M_impl.super__Vector_impl_data._M_start; ppVar5 != ppVar1; ppVar5 = ppVar5 + 1) {
    checkEndpointDataTypes(ppVar5->object);
  }
  ppVar6 = (p->stateVariables).
           super__Vector_base<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar2 = (p->stateVariables).
           super__Vector_base<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (ppVar6 == ppVar2) {
      return;
    }
    pEVar3 = (ppVar6->object->initialValue).object;
    if (pEVar3 != (Expression *)0x0) {
      iVar4 = (*(pEVar3->super_Statement).super_ASTObject._vptr_ASTObject[0xe])();
      if ((char)iVar4 == '\0') {
        pEVar3 = (ppVar6->object->initialValue).object;
        if (pEVar3 == (Expression *)0x0) {
          throwInternalCompilerError("object != nullptr","operator->",0x3c);
        }
        CompileMessageHelpers::createMessage<>(&local_50,syntax,error,"Expected a constant value");
        AST::Context::throwError(&(pEVar3->super_Statement).super_ASTObject.context,&local_50,false)
        ;
      }
    }
    ppVar6 = ppVar6 + 1;
  } while( true );
}

Assistant:

void visit (AST::Processor& p) override
        {
            super::visit (p);
            checkForDuplicateFunctions (p.functions);

            for (auto input : p.endpoints)
                checkEndpointDataTypes (input.get());

            for (auto& v : p.stateVariables)
                if (v->initialValue != nullptr && ! v->initialValue->isCompileTimeConstant())
                    v->initialValue->context.throwError (Errors::expectedConstant());
        }